

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Vector3f *
phyr::uniformSampleCone(Point2f *u,double cosThetaMax,Vector3f *x,Vector3f *y,Vector3f *z)

{
  Point2<double> *in_RSI;
  Vector3f *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double phi;
  double sinTheta;
  double cosTheta;
  Vector3<double> *in_stack_ffffffffffffff48;
  Vector3f *this;
  
  this = in_RDI;
  dVar1 = Point2<double>::operator[](in_RSI,0);
  dVar1 = lerp(dVar1,in_XMM0_Qa,1.0);
  sqrt(-dVar1 * dVar1 + 1.0);
  dVar1 = Point2<double>::operator[](in_RSI,1);
  dVar1 = dVar1 * 2.0 * 3.141592653589793;
  cos(dVar1);
  operator*((double)this,in_stack_ffffffffffffff48);
  sin(dVar1);
  operator*((double)this,in_stack_ffffffffffffff48);
  Vector3<double>::operator+(this,in_stack_ffffffffffffff48);
  operator*((double)this,in_stack_ffffffffffffff48);
  Vector3<double>::operator+(this,in_stack_ffffffffffffff48);
  return in_RDI;
}

Assistant:

Vector3f uniformSampleCone(const Point2f& u, Real cosThetaMax,
                           const Vector3f& x, const Vector3f& y,
                           const Vector3f& z) {
    Real cosTheta = lerp(u[0], cosThetaMax, 1.f);
    Real sinTheta = std::sqrt((Real)1. - cosTheta * cosTheta);
    Real phi = u[1] * 2 * Pi;
    return std::cos(phi) * sinTheta * x + std::sin(phi) * sinTheta * y + cosTheta * z;
}